

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)22>_> *
vkt::BindingModel::anon_unknown_1::BufferRenderInstance::createDescriptorSet
          (Move<vk::Handle<(vk::HandleType)22>_> *__return_storage_ptr__,DeviceInterface *vki,
          DescriptorUpdateMethod updateMethod,VkDevice device,
          VkDescriptorSetLayout descriptorSetLayout,VkDescriptorPool descriptorPool,
          VkDescriptorType descriptorType,ShaderInputInterface shaderInterface,VkBuffer bufferA,
          deUint32 offsetA,VkBuffer bufferB,deUint32 offsetB,
          DescriptorSetUpdateBuilder *updateBuilder,
          Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,RawUpdateRegistry *updateRegistry,
          VkPipelineLayout pipelineLayout)

{
  RefData<vk::Handle<(vk::HandleType)22>_> data;
  RefData<vk::Handle<(vk::HandleType)22>_> data_00;
  VkDescriptorSetLayout *device_00;
  VkDescriptorPool descriptorSetLayout_00;
  Handle<(vk::HandleType)22> *pHVar1;
  VkPipelineLayout local_168;
  VkDescriptorSet local_160;
  VkBuffer local_158;
  VkBuffer local_150;
  VkDescriptorPool local_148;
  VkDescriptorSetLayout local_140;
  Move<vk::Handle<(vk::HandleType)22>_> local_138;
  RefData<vk::Handle<(vk::HandleType)22>_> local_118;
  Move<vk::Handle<(vk::HandleType)22>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)22>_> local_c8;
  undefined1 local_a1;
  undefined1 local_a0 [8];
  VkDescriptorSetAllocateInfo allocInfo;
  VkDevice device_local;
  DescriptorUpdateMethod updateMethod_local;
  DeviceInterface *vki_local;
  VkPipelineLayout pipelineLayout_local;
  VkBuffer bufferB_local;
  VkBuffer bufferA_local;
  VkDescriptorPool descriptorPool_local;
  VkDescriptorSetLayout descriptorSetLayout_local;
  Move<vk::Handle<(vk::HandleType)22>_> *descriptorSet;
  
  local_a0._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.descriptorPool.m_internal._0_4_ = 1;
  allocInfo._24_8_ = &descriptorPool_local;
  local_a1 = 0;
  allocInfo.pNext = (void *)descriptorPool.m_internal;
  allocInfo.pSetLayouts = (VkDescriptorSetLayout *)device;
  descriptorPool_local.m_internal = descriptorSetLayout.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(__return_storage_ptr__);
  if ((updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) ||
     (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&local_138);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_118,(Move *)&local_138);
    data_00.deleter.m_deviceIface._0_4_ = (int)local_118.deleter.m_deviceIface;
    data_00.object.m_internal = local_118.object.m_internal;
    data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_118.deleter.m_deviceIface >> 0x20);
    data_00.deleter.m_device = local_118.deleter.m_device;
    data_00.deleter.m_pool.m_internal._0_4_ = (int)local_118.deleter.m_pool.m_internal;
    data_00.deleter.m_pool.m_internal._4_4_ = (int)(local_118.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=
              (__return_storage_ptr__,data_00);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_138);
  }
  else {
    ::vk::allocateDescriptorSet
              (&local_e8,vki,(VkDevice)allocInfo.pSetLayouts,(VkDescriptorSetAllocateInfo *)local_a0
              );
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
    data.deleter.m_deviceIface._0_4_ = (int)local_c8.deleter.m_deviceIface;
    data.object.m_internal = local_c8.object.m_internal;
    data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c8.deleter.m_deviceIface >> 0x20);
    data.deleter.m_device = local_c8.deleter.m_device;
    data.deleter.m_pool.m_internal._0_4_ = (int)local_c8.deleter.m_pool.m_internal;
    data.deleter.m_pool.m_internal._4_4_ = (int)(local_c8.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(__return_storage_ptr__,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_e8);
  }
  descriptorSetLayout_00.m_internal = descriptorPool_local.m_internal;
  device_00 = allocInfo.pSetLayouts;
  if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) {
    local_140.m_internal = descriptorPool_local.m_internal;
    local_150.m_internal = bufferA.m_internal;
    local_158.m_internal = bufferB.m_internal;
    local_148.m_internal = descriptorPool.m_internal;
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    local_160.m_internal = pHVar1->m_internal;
    ::vk::Handle<(vk::HandleType)16>::Handle(&local_168,0);
    writeDescriptorSetWithTemplate
              (vki,(VkDevice)device_00,local_140,local_148,descriptorType,shaderInterface,local_150,
               offsetA,local_158,offsetB,local_160,updateTemplate,updateRegistry,false,local_168);
  }
  else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    writeDescriptorSetWithTemplate
              (vki,(VkDevice)device_00,(VkDescriptorSetLayout)descriptorSetLayout_00.m_internal,
               descriptorPool,descriptorType,shaderInterface,bufferA,offsetA,bufferB,offsetB,
               (VkDescriptorSet)pHVar1->m_internal,updateTemplate,updateRegistry,true,pipelineLayout
              );
  }
  else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    writeDescriptorSet(vki,(VkDevice)device_00,
                       (VkDescriptorSetLayout)descriptorSetLayout_00.m_internal,descriptorPool,
                       descriptorType,shaderInterface,bufferA,offsetA,bufferB,offsetB,
                       (VkDescriptorSet)pHVar1->m_internal,updateBuilder,
                       DESCRIPTOR_UPDATE_METHOD_WITH_PUSH);
  }
  else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    writeDescriptorSet(vki,(VkDevice)device_00,
                       (VkDescriptorSetLayout)descriptorSetLayout_00.m_internal,descriptorPool,
                       descriptorType,shaderInterface,bufferA,offsetA,bufferB,offsetB,
                       (VkDescriptorSet)pHVar1->m_internal,updateBuilder,
                       DESCRIPTOR_UPDATE_METHOD_NORMAL);
  }
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkDescriptorSet> BufferRenderInstance::createDescriptorSet (const vk::DeviceInterface&						vki,
																		 DescriptorUpdateMethod							updateMethod,
																		 vk::VkDevice									device,
																		 vk::VkDescriptorSetLayout						descriptorSetLayout,
																		 vk::VkDescriptorPool							descriptorPool,
																		 vk::VkDescriptorType							descriptorType,
																		 ShaderInputInterface							shaderInterface,
																		 vk::VkBuffer									bufferA,
																		 deUint32										offsetA,
																		 vk::VkBuffer									bufferB,
																		 deUint32										offsetB,
																		 vk::DescriptorSetUpdateBuilder&				updateBuilder,
																		 vk::Move<vk::VkDescriptorUpdateTemplateKHR>&	updateTemplate,
																		 RawUpdateRegistry&								updateRegistry,
																		 vk::VkPipelineLayout							pipelineLayout)
{
	const vk::VkDescriptorSetAllocateInfo	allocInfo		=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
		DE_NULL,
		descriptorPool,
		1u,
		&descriptorSetLayout
	};

	vk::Move<vk::VkDescriptorSet>			descriptorSet;
	if (updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH && updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)
	{
		descriptorSet = allocateDescriptorSet(vki, device, &allocInfo);
	}
	else
	{
		descriptorSet = vk::Move<vk::VkDescriptorSet>();
	}

	if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE)
	{
		writeDescriptorSetWithTemplate(vki, device, descriptorSetLayout, descriptorPool, descriptorType, shaderInterface, bufferA, offsetA, bufferB, offsetB, *descriptorSet, updateTemplate, updateRegistry);
	}
	else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)
	{
		writeDescriptorSetWithTemplate(vki, device, descriptorSetLayout, descriptorPool, descriptorType, shaderInterface, bufferA, offsetA, bufferB, offsetB, *descriptorSet, updateTemplate, updateRegistry, true, pipelineLayout);
	}
	else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		writeDescriptorSet(vki, device, descriptorSetLayout, descriptorPool, descriptorType, shaderInterface, bufferA, offsetA, bufferB, offsetB, *descriptorSet, updateBuilder, updateMethod);
	}
	else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		writeDescriptorSet(vki, device, descriptorSetLayout, descriptorPool, descriptorType, shaderInterface, bufferA, offsetA, bufferB, offsetB, *descriptorSet, updateBuilder);
	}

	return descriptorSet;
}